

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_file.c
# Opt level: O0

err_t cmdFileValNotExist(int count,char **names)

{
  bool_t bVar1;
  int iVar2;
  int in_EDI;
  bool bVar3;
  int ch;
  file_t file;
  err_t code;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  file_t in_stack_ffffffffffffffe0;
  int local_8;
  err_t local_4;
  
  local_8 = in_EDI;
  do {
    if (local_8 == 0) goto LAB_00105cb6;
    in_stack_ffffffffffffffe0 =
         fileOpen((char *)in_stack_ffffffffffffffe0,
                  (char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    iVar2 = 0xcb;
    if (in_stack_ffffffffffffffe0 != (file_t)0x0) {
      iVar2 = 0;
    }
    local_8 = local_8 + -1;
  } while (iVar2 != 0);
  bVar1 = fileClose((file_t)0x105bd6);
  local_4 = 0x67;
  if (bVar1 != 0) {
    local_4 = 0;
  }
  if (local_4 == 0) {
    iVar2 = printf("Some files already exist. Overwrite [y/n]?");
    if (iVar2 < 0) {
      local_4 = 0xcc;
    }
    else {
      do {
        iVar2 = cmdTermGetch();
        bVar3 = false;
        if ((((iVar2 != 0x59) && (bVar3 = false, iVar2 != 0x79)) && (bVar3 = false, iVar2 != 0x4e))
           && (bVar3 = false, iVar2 != 0x6e)) {
          bVar3 = iVar2 != 10;
        }
      } while (bVar3);
      printf("\n");
      if (((iVar2 == 0x4e) || (iVar2 == 0x6e)) || (iVar2 == 10)) {
        local_4 = 0xcc;
      }
      else {
LAB_00105cb6:
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

err_t cmdFileValNotExist(int count, char* names[])
{
	err_t code;
	file_t file;
	int ch;
	for (; count--; names++)
	{
		ASSERT(strIsValid(*names));
		code = cmdFileOpen(file, *names, "rb");
		if (code == ERR_OK)
		{
			code = cmdFileClose(file);
			ERR_CALL_CHECK(code);
			if (printf("Some files already exist. Overwrite [y/n]?") < 0)
				return ERR_FILE_EXISTS;
			do
				ch = cmdTermGetch();
			while (ch != 'Y' && ch != 'y' && ch != 'N' && ch != 'n' && ch != '\n');
			printf("\n");
			if (ch == 'N' || ch == 'n' || ch == '\n')
				return ERR_FILE_EXISTS;
			break;
		}
	}
	return ERR_OK;
}